

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_choices_validation(void)

{
  cargo_t ctx;
  int iVar1;
  cargo_validation_t *vd;
  char *pcVar2;
  cargo_t cargo;
  char *str;
  char *args [3];
  cargo_t local_48;
  void *local_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  
  iVar1 = cargo_init(&local_48,0,"program");
  if (iVar1 == 0) {
    local_40 = (void *)0x0;
    iVar1 = cargo_add_option(local_48,0,"--alpha -a",(char *)0x0,"s");
    ctx = local_48;
    if (iVar1 == 0) {
      vd = cargo_validate_choices(CARGO_VALIDATE_CHOICES_NONE,CARGO_STRING,2,"abc","def");
      iVar1 = cargo_add_validation(ctx,CARGO_VALIDATION_NONE,"--alpha",vd);
      if (iVar1 == 0) {
        local_28 = "abc";
        local_38 = "program";
        pcStack_30 = "--alpha";
        iVar1 = cargo_parse(local_48,0,1,3,&local_38);
        if (iVar1 == 0) {
          local_28 = "def";
          local_38 = "program";
          pcStack_30 = "--alpha";
          iVar1 = cargo_parse(local_48,0,1,3,&local_38);
          if (iVar1 == 0) {
            local_28 = "klmn";
            local_38 = "program";
            pcStack_30 = "--alpha";
            iVar1 = cargo_parse(local_48,0,1,3,&local_38);
            pcVar2 = "Expected parse failure for klmn";
            if (iVar1 < 0) {
              local_28 = "ABC";
              local_38 = "program";
              pcStack_30 = "--alpha";
              iVar1 = cargo_parse(local_48,0,1,3,&local_38);
              if (iVar1 == 0) {
                local_28 = "DEF";
                local_38 = "program";
                pcStack_30 = "--alpha";
                iVar1 = cargo_parse(local_48,0,1,3,&local_38);
                pcVar2 = "Failed to parse";
                if (iVar1 == 0) {
                  pcVar2 = (char *)0x0;
                }
              }
              else {
                pcVar2 = "Failed to parse";
              }
            }
          }
          else {
            pcVar2 = "Failed to parse";
          }
        }
        else {
          pcVar2 = "Failed to parse";
        }
      }
      else {
        pcVar2 = "Failed to add validation";
      }
    }
    else {
      pcVar2 = "Failed to add option";
    }
    if (local_40 != (void *)0x0) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(local_40);
      }
      else {
        (*replaced_cargo_free)(local_40);
      }
      local_40 = (void *)0x0;
    }
    cargo_destroy(&local_48);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_choices_validation)
{
    char *str = NULL;
    _CARGO_ADD_TEST_VALIDATE("s", &str,
            cargo_validate_choices, 0, CARGO_STRING,
            2, "abc", "def");
    _CARGO_TEST_VALIDATE_VALUE(abc, 0);
    _CARGO_TEST_VALIDATE_VALUE(def, 0);
    _CARGO_TEST_VALIDATE_VALUE(klmn, 1);
    _CARGO_TEST_VALIDATE_VALUE(ABC, 0);
    _CARGO_TEST_VALIDATE_VALUE(DEF, 0);
    _TEST_CLEANUP();
    _cargo_xfree(&str);
}